

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.h
# Opt level: O3

void wallet::WalletDescriptor::
     SerializationOps<DataStream,wallet::WalletDescriptor_const,ActionSerialize>
               (WalletDescriptor *obj,DataStream *s)

{
  long in_FS_OFFSET;
  string descriptor_str;
  anon_class_8_1_53f8d39f local_48;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_48.descriptor_str = &local_40;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ActionSerialize::
  SerWrite<DataStream,wallet::WalletDescriptor_const&,wallet::WalletDescriptor::SerializationOps<DataStream,wallet::WalletDescriptor_const,ActionSerialize>(wallet::WalletDescriptor_const&,DataStream&,ActionSerialize)::_lambda(DataStream&,wallet::WalletDescriptor_const&)_1_>
            (s,obj,&local_48);
  SerializeMany<DataStream,std::__cxx11::string,unsigned_long,int,int,int>
            (s,&local_40,&obj->creation_time,&obj->next_index,&obj->range_start,&obj->range_end);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(WalletDescriptor, obj)
    {
        std::string descriptor_str;
        SER_WRITE(obj, descriptor_str = obj.descriptor->ToString());
        READWRITE(descriptor_str, obj.creation_time, obj.next_index, obj.range_start, obj.range_end);
        SER_READ(obj, obj.DeserializeDescriptor(descriptor_str));
    }